

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# max_sub_array.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<int> __l;
  int iVar1;
  ostream *this;
  allocator<int> local_69;
  int local_68 [10];
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> test;
  char **argv_local;
  int argc_local;
  
  local_68[4] = 2;
  local_68[5] = -1;
  local_68[6] = 2;
  local_68[7] = -4;
  local_68[0] = 2;
  local_68[1] = 4;
  local_68[2] = -7;
  local_68[3] = 5;
  local_68[8] = 3;
  local_40 = local_68;
  local_38 = 9;
  test.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)argv;
  std::allocator<int>::allocator(&local_69);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_30,__l,&local_69);
  std::allocator<int>::~allocator(&local_69);
  iVar1 = find_max_subarray((vector<int,_std::allocator<int>_> *)local_30);
  this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	std::vector<int> test = {2, 4, -7, 5, 2, -1, 2, -4, 3};

	cout << find_max_subarray(test) << endl;
	return 0;
}